

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O2

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::anon_unknown_0::TypeMerging::mergeableSupertypesFirst
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          TypeMerging *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<std::optional<wasm::HeapType>_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp:149:14)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<std::optional<wasm::HeapType>_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp:149:14)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  HeapTypeOrdering::supertypesFirst<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
            (__return_storage_ptr__,(HeapTypeOrdering *)types,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_30,
             (function<std::optional<wasm::HeapType>_(wasm::HeapType)> *)
             std::
             _Function_handler<std::optional<wasm::HeapType>_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp:149:14)>
             ::_M_manager);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType>
  mergeableSupertypesFirst(const std::vector<HeapType>& types) {
    return HeapTypeOrdering::supertypesFirst(
      types, [&](HeapType type) -> std::optional<HeapType> {
        if (auto super = type.getDeclaredSuperType()) {
          return getMerged(*super);
        }
        return std::nullopt;
      });
  }